

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O3

void __thiscall EmulNet::EmulNet(EmulNet *this,Params *p)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int (*paiVar4) [3600];
  
  this->_vptr_EmulNet = (_func_int **)&PTR__EmulNet_0010ad00;
  (this->emulnet)._vptr_EM = (_func_int **)&PTR__EM_0010ad30;
  this->par = p;
  (this->emulnet).nextid = 1;
  (this->emulnet).currbuffsize = 0;
  this->enInited = 0;
  paiVar4 = this->recv_msgs;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      piVar1 = paiVar4[-0x3e9] + lVar3;
      piVar1[0] = 0;
      piVar1[1] = 0;
      piVar1[2] = 0;
      piVar1[3] = 0;
      piVar1 = *paiVar4 + lVar3;
      piVar1[0] = 0;
      piVar1[1] = 0;
      piVar1[2] = 0;
      piVar1[3] = 0;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xe10);
    lVar2 = lVar2 + 1;
    paiVar4 = paiVar4 + 1;
  } while (lVar2 != 1000);
  return;
}

Assistant:

EmulNet::EmulNet(Params *p)
{
	//trace.funcEntry("EmulNet::EmulNet");
	int i,j;
	par = p;
	emulnet.setNextId(1);
	emulnet.settCurrBuffSize(0);
	enInited=0;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			sent_msgs[i][j] = 0;
			recv_msgs[i][j] = 0;
		}
	}
	//trace.funcExit("EmulNet::EmulNet", SUCCESS);
}